

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_decoder_seek_to_pcm_frame(ma_decoder *pDecoder,ma_uint64 frameIndex)

{
  ma_result mVar1;
  ma_uint64 frameIndex_00;
  ma_uint32 internalSampleRate;
  ma_uint64 currentFrameIndex;
  
  mVar1 = MA_INVALID_ARGS;
  if ((pDecoder != (ma_decoder *)0x0) && (pDecoder->pBackend != (ma_data_source *)0x0)) {
    mVar1 = ma_data_source_get_data_format
                      (pDecoder->pBackend,(ma_format *)0x0,(ma_uint32 *)0x0,&internalSampleRate,
                       (ma_channel *)0x0,0);
    if (mVar1 == MA_SUCCESS) {
      frameIndex_00 = frameIndex;
      if (internalSampleRate != pDecoder->outputSampleRate) {
        frameIndex_00 =
             ma_calculate_frame_count_after_resampling
                       (internalSampleRate,pDecoder->outputSampleRate,frameIndex);
      }
      ma_data_source_get_cursor_in_pcm_frames(pDecoder->pBackend,&currentFrameIndex);
      mVar1 = MA_SUCCESS;
      if (currentFrameIndex != frameIndex_00) {
        mVar1 = ma_data_source_seek_to_pcm_frame(pDecoder->pBackend,frameIndex_00);
        if (mVar1 == MA_SUCCESS) {
          pDecoder->readPointerInPCMFrames = frameIndex;
        }
        ma_data_converter_reset(&pDecoder->converter);
      }
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_decoder_seek_to_pcm_frame(ma_decoder* pDecoder, ma_uint64 frameIndex)
{
    if (pDecoder == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pDecoder->pBackend != NULL) {
        ma_result result;
        ma_uint64 internalFrameIndex;
        ma_uint32 internalSampleRate;
        ma_uint64 currentFrameIndex;

        result = ma_data_source_get_data_format(pDecoder->pBackend, NULL, NULL, &internalSampleRate, NULL, 0);
        if (result != MA_SUCCESS) {
            return result;  /* Failed to retrieve the internal sample rate. */
        }

        if (internalSampleRate == pDecoder->outputSampleRate) {
            internalFrameIndex = frameIndex;
        } else {
            internalFrameIndex = ma_calculate_frame_count_after_resampling(internalSampleRate, pDecoder->outputSampleRate, frameIndex);
        }

        /* Only seek if we're requesting a different frame to what we're currently sitting on. */
        ma_data_source_get_cursor_in_pcm_frames(pDecoder->pBackend, &currentFrameIndex);
        if (currentFrameIndex != internalFrameIndex) {
            result = ma_data_source_seek_to_pcm_frame(pDecoder->pBackend, internalFrameIndex);
            if (result == MA_SUCCESS) {
                pDecoder->readPointerInPCMFrames = frameIndex;
            }

            /* Reset the data converter so that any cached data in the resampler is cleared. */
            ma_data_converter_reset(&pDecoder->converter);
        }

        return result;
    }

    /* Should never get here, but if we do it means onSeekToPCMFrame was not set by the backend. */
    return MA_INVALID_ARGS;
}